

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall xLearn::Solver::StartWork(Solver *this)

{
  ostream *poVar1;
  allocator local_4e;
  allocator local_4d;
  Logger local_4c;
  string local_48;
  string local_28;
  
  if ((this->hyper_param_).is_train == true) {
    local_4c.severity_ = INFO;
    std::__cxx11::string::string
              ((string *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_4d);
    std::__cxx11::string::string((string *)&local_48,"StartWork",&local_4e);
    poVar1 = Logger::Start(INFO,&local_28,0x20b,&local_48);
    std::operator<<(poVar1,"Start training work.");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    Logger::~Logger(&local_4c);
    start_train_work(this);
  }
  else {
    local_4c.severity_ = INFO;
    std::__cxx11::string::string
              ((string *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_4d);
    std::__cxx11::string::string((string *)&local_48,"StartWork",&local_4e);
    poVar1 = Logger::Start(INFO,&local_28,0x20e,&local_48);
    std::operator<<(poVar1,"Start inference work.");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
    Logger::~Logger(&local_4c);
    start_prediction_work(this);
  }
  return;
}

Assistant:

void Solver::StartWork() {
  if (hyper_param_.is_train) {
    LOG(INFO) << "Start training work.";
    start_train_work();
  } else {
    LOG(INFO) << "Start inference work.";
    start_prediction_work();
  }
}